

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkUniversal::IntLoadConstraint_C
          (ChLinkUniversal *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  int iVar1;
  Scalar *pSVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 local_58 [56];
  undefined1 auVar5 [32];
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    local_58._0_8_ =
         c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
             m_data.array[0];
    local_58._8_8_ =
         c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
             m_data.array[1];
    local_58._16_8_ =
         c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
             m_data.array[2];
    auVar7._24_8_ =
         c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
             m_data.array[3];
    auVar7._0_24_ = local_58._0_24_;
    if (do_clamp) {
      auVar4._8_8_ = recovery_clamp;
      auVar4._0_8_ = recovery_clamp;
      auVar5._16_8_ = recovery_clamp;
      auVar5._0_16_ = auVar4;
      auVar5._24_8_ = recovery_clamp;
      auVar3._8_8_ = 0x8000000000000000;
      auVar3._0_8_ = 0x8000000000000000;
      auVar3 = vxorpd_avx512vl(auVar4,auVar3);
      auVar6._0_8_ = auVar3._0_8_;
      auVar6._8_8_ = auVar6._0_8_;
      auVar6._16_8_ = auVar6._0_8_;
      auVar6._24_8_ = auVar6._0_8_;
      auVar7 = vmaxpd_avx(auVar7,auVar6);
      auVar7 = vminpd_avx(auVar7,auVar5);
      local_58._0_24_ = auVar7._0_24_;
    }
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)off_L);
    *pSVar2 = (double)local_58._0_8_ + *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 1));
    auVar3 = vpermilpd_avx(local_58._0_16_,1);
    *pSVar2 = auVar3._0_8_ + *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 2));
    *pSVar2 = (double)local_58._16_8_ + *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 3));
    auVar3 = vpermilpd_avx(local_58._0_16_,1);
    *pSVar2 = auVar3._0_8_ + *pSVar2;
  }
  return;
}

Assistant:

void ChLinkUniversal::IntLoadConstraint_C(const unsigned int off_L,  ///< offset in Qc residual
                                          ChVectorDynamic<>& Qc,     ///< result: the Qc residual, Qc += c*C
                                          const double c,            ///< a scaling factor
                                          bool do_clamp,             ///< apply clamping to c*C?
                                          double recovery_clamp      ///< value for min/max clamping of c*C
                                          ) {
    if (!IsActive())
        return;

    double cnstr_x_violation = c * m_C(0);
    double cnstr_y_violation = c * m_C(1);
    double cnstr_z_violation = c * m_C(2);
    double cnstr_dot_violation = c * m_C(3);

    if (do_clamp) {
        cnstr_x_violation = ChMin(ChMax(cnstr_x_violation, -recovery_clamp), recovery_clamp);
        cnstr_y_violation = ChMin(ChMax(cnstr_y_violation, -recovery_clamp), recovery_clamp);
        cnstr_z_violation = ChMin(ChMax(cnstr_z_violation, -recovery_clamp), recovery_clamp);
        cnstr_dot_violation = ChMin(ChMax(cnstr_dot_violation, -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cnstr_x_violation;
    Qc(off_L + 1) += cnstr_y_violation;
    Qc(off_L + 2) += cnstr_z_violation;
    Qc(off_L + 3) += cnstr_dot_violation;
}